

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryBone(aiBone *b)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint32_t local_14;
  uint32_t old;
  uint32_t len;
  aiBone *b_local;
  
  ofs = WriteMagic(0x123a);
  uVar1 = Write<aiString>(&b->mName);
  uVar2 = Write<unsigned_int>(&b->mNumWeights);
  uVar3 = Write<aiMatrix4x4t<float>>(&b->mOffsetMatrix);
  if ((shortened & 1U) == 0) {
    sVar4 = fwrite(b->mWeights,1,(ulong)b->mNumWeights << 3,(FILE *)out);
    local_14 = (uint32_t)sVar4;
  }
  else {
    local_14 = WriteBounds<aiVertexWeight>(b->mWeights,b->mNumWeights);
  }
  local_14 = local_14 + uVar3 + uVar2 + uVar1;
  ChangeInteger(ofs,local_14);
  return local_14;
}

Assistant:

uint32_t WriteBinaryBone(const aiBone* b)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIBONE);

	len += Write<aiString>(b->mName);
	len += Write<unsigned int>(b->mNumWeights);
	len += Write<aiMatrix4x4>(b->mOffsetMatrix);

	// for the moment we write dumb min/max values for the bones, too.
	// maybe I'll add a better, hash-like solution later
	if (shortened) {
		len += WriteBounds(b->mWeights,b->mNumWeights);
	} // else write as usual
	else len += static_cast<uint32_t>(fwrite(b->mWeights,1,b->mNumWeights*sizeof(aiVertexWeight),out));

	ChangeInteger(old,len);
	return len;
}